

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

void __thiscall glslang::TParseContext::setPrecisionDefaults(TParseContext *this)

{
  EProfile EVar1;
  int type;
  uint uVar2;
  long lVar3;
  TParseContext *this_00;
  TSampler local_1c;
  
  for (lVar3 = 0; lVar3 != 0x1c; lVar3 = lVar3 + 1) {
    this->defaultPrecision[lVar3] = EpqNone;
  }
  for (lVar3 = 0; lVar3 != 0x1f80; lVar3 = lVar3 + 1) {
    this->defaultSamplerPrecision[lVar3] = EpqNone;
  }
  if ((this->precisionManager).obey != false) {
    if ((this->super_TParseContextBase).super_TParseVersions.profile == EEsProfile) {
      local_1c = (TSampler)0x1f100201;
      this_00 = this;
      uVar2 = computeSamplerTypeIndex(this,&local_1c);
      this->defaultSamplerPrecision[uVar2] = EpqLow;
      local_1c = (TSampler)0x1f100401;
      uVar2 = computeSamplerTypeIndex(this_00,&local_1c);
      this->defaultSamplerPrecision[uVar2] = EpqLow;
      local_1c = (TSampler)0x3f100201;
      uVar2 = computeSamplerTypeIndex(this_00,&local_1c);
      this->defaultSamplerPrecision[uVar2] = EpqLow;
    }
    if ((this->super_TParseContextBase).parsingBuiltins == false) {
      EVar1 = (this->super_TParseContextBase).super_TParseVersions.profile;
      if ((EVar1 == EEsProfile) &&
         ((this->super_TParseContextBase).super_TParseVersions.language == EShLangFragment)) {
        this->defaultPrecision[8] = EpqMedium;
        this->defaultPrecision[9] = EpqMedium;
      }
      else {
        this->defaultPrecision[8] = EpqHigh;
        this->defaultPrecision[9] = EpqHigh;
        this->defaultPrecision[1] = EpqHigh;
        if (EVar1 != EEsProfile) {
          for (lVar3 = 0; lVar3 != 0x1f80; lVar3 = lVar3 + 1) {
            this->defaultSamplerPrecision[lVar3] = EpqHigh;
          }
        }
      }
    }
    this->defaultPrecision[0xd] = EpqHigh;
    this->defaultPrecision[0xe] = EpqLow;
  }
  return;
}

Assistant:

void TParseContext::setPrecisionDefaults()
{
    // Set all precision defaults to EpqNone, which is correct for all types
    // when not obeying precision qualifiers, and correct for types that don't
    // have defaults (thus getting an error on use) when obeying precision
    // qualifiers.

    for (int type = 0; type < EbtNumTypes; ++type)
        defaultPrecision[type] = EpqNone;

    for (int type = 0; type < maxSamplerIndex; ++type)
        defaultSamplerPrecision[type] = EpqNone;

    // replace with real precision defaults for those that have them
    if (obeyPrecisionQualifiers()) {
        if (isEsProfile()) {
            // Most don't have defaults, a few default to lowp.
            TSampler sampler;
            sampler.set(EbtFloat, Esd2D);
            defaultSamplerPrecision[computeSamplerTypeIndex(sampler)] = EpqLow;
            sampler.set(EbtFloat, EsdCube);
            defaultSamplerPrecision[computeSamplerTypeIndex(sampler)] = EpqLow;
            sampler.set(EbtFloat, Esd2D);
            sampler.setExternal(true);
            defaultSamplerPrecision[computeSamplerTypeIndex(sampler)] = EpqLow;
        }

        // If we are parsing built-in computational variables/functions, it is meaningful to record
        // whether the built-in has no precision qualifier, as that ambiguity
        // is used to resolve the precision from the supplied arguments/operands instead.
        // So, we don't actually want to replace EpqNone with a default precision for built-ins.
        if (! parsingBuiltins) {
            if (isEsProfile() && language == EShLangFragment) {
                defaultPrecision[EbtInt] = EpqMedium;
                defaultPrecision[EbtUint] = EpqMedium;
            } else {
                defaultPrecision[EbtInt] = EpqHigh;
                defaultPrecision[EbtUint] = EpqHigh;
                defaultPrecision[EbtFloat] = EpqHigh;
            }

            if (!isEsProfile()) {
                // Non-ES profile
                // All sampler precisions default to highp.
                for (int type = 0; type < maxSamplerIndex; ++type)
                    defaultSamplerPrecision[type] = EpqHigh;
            }
        }

        defaultPrecision[EbtSampler] = EpqLow;
        defaultPrecision[EbtAtomicUint] = EpqHigh;
    }
}